

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
               (int *keys,int end,
               Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *compare,int start,bool type)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  type t;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  if (start + 1 < end) {
    uVar10 = end - 1;
    uVar3 = uVar10 - start;
    if (0x18 < (int)uVar3) {
LAB_005a49d1:
      iVar4 = (uVar3 >> 1) + start;
      iVar1 = keys[iVar4];
      lVar6 = (long)start;
      uVar3 = uVar10;
      uVar9 = start;
      do {
        uVar12 = (ulong)uVar3;
        if ((type & 1U) == 0) {
          if ((int)uVar9 < (int)uVar10) {
            piVar8 = keys + (int)uVar9;
            do {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_130,compare,*piVar8,iVar1);
              if (local_130.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_b0,0,(type *)0x0);
              iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_130,&local_b0);
              if (0 < iVar5) break;
              uVar9 = uVar9 + 1;
              piVar8 = piVar8 + 1;
            } while (uVar10 != uVar9);
          }
          if (start < (int)uVar3) {
            uVar12 = (ulong)(int)uVar3;
            while (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator()((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_130,compare,keys[uVar12],iVar1),
                  local_130.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_b0,0,(type *)0x0);
              iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_130,&local_b0);
              if ((iVar5 < 1) || (uVar12 = uVar12 - 1, (long)uVar12 <= lVar6)) break;
            }
          }
        }
        else {
          if ((int)uVar9 < (int)uVar10) {
            lVar7 = 0;
            do {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_130,compare,keys[(int)uVar9 + lVar7],iVar1);
              if (local_130.fpclass == cpp_dec_float_NaN) {
                iVar5 = (int)lVar7;
                goto LAB_005a4b4b;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_b0,0,(type *)0x0);
              iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_130,&local_b0);
            } while ((iVar5 < 0) &&
                    (lVar7 = lVar7 + 1, (long)(int)uVar10 - (long)(int)uVar9 != lVar7));
            iVar5 = (int)lVar7;
LAB_005a4b4b:
            uVar9 = uVar9 + iVar5;
          }
          if (start < (int)uVar3) {
            uVar12 = (ulong)(int)uVar3;
            while (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator()((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_130,compare,keys[uVar12],iVar1),
                  local_130.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_b0,0,(type *)0x0);
              iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_130,&local_b0);
              if ((iVar5 < 0) || (uVar12 = uVar12 - 1, (long)uVar12 <= lVar6)) break;
            }
          }
        }
        uVar3 = (uint)uVar12;
        if ((int)uVar3 <= (int)uVar9) goto LAB_005a4c54;
        iVar5 = keys[(int)uVar9];
        keys[(int)uVar9] = keys[(int)uVar3];
        keys[(int)uVar3] = iVar5;
        uVar9 = uVar9 + 1;
        uVar3 = uVar3 - 1;
      } while( true );
    }
LAB_005a4e2b:
    if (0 < (int)uVar3) {
      SPxShellsort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
                (keys,uVar10,compare,start);
    }
  }
  return;
LAB_005a4c54:
  if ((type & 1U) == 0) {
    if (start < (int)uVar3) {
      uVar12 = (ulong)(int)uVar3;
      while (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator()((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_130,compare,iVar1,keys[uVar12]),
            local_130.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_b0,0,(type *)0x0);
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_130,&local_b0);
        if ((0 < iVar5) || (uVar12 = uVar12 - 1, (long)uVar12 <= lVar6)) break;
      }
    }
    uVar3 = (uint)uVar12;
    if (uVar3 == uVar10) {
      iVar1 = keys[(int)uVar3];
      keys[(int)uVar3] = keys[iVar4];
      keys[iVar4] = iVar1;
      uVar3 = uVar3 - 1;
    }
  }
  else {
    if ((int)uVar9 < (int)uVar10) {
      piVar8 = keys + (int)uVar9;
      do {
        Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator()((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_130,compare,iVar1,*piVar8);
        if (local_130.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_b0,0,(type *)0x0);
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_130,&local_b0);
        if (iVar5 < 0) break;
        uVar9 = uVar9 + 1;
        piVar8 = piVar8 + 1;
      } while (uVar10 != uVar9);
    }
    if (uVar9 == start) {
      iVar1 = keys[(int)uVar9];
      keys[(int)uVar9] = keys[iVar4];
      keys[iVar4] = iVar1;
      uVar9 = uVar9 + 1;
    }
  }
  if ((int)(uVar10 - uVar9) < (int)(uVar3 - start)) {
    bVar2 = (int)uVar10 <= (int)uVar9;
    uVar11 = uVar3;
    uVar3 = uVar10;
    uVar10 = uVar9;
    uVar9 = start;
    if (bVar2) goto LAB_005a4e0a;
  }
  else {
    bVar2 = (int)uVar3 <= start;
    uVar11 = uVar10;
    uVar10 = start;
    start = uVar9;
    if (bVar2) goto LAB_005a4e0a;
  }
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (keys,uVar3 + 1,compare,uVar10,(bool)(~type & 1));
  start = uVar9;
LAB_005a4e0a:
  uVar10 = uVar11;
  type = (bool)(type ^ 1);
  uVar3 = uVar10 - start;
  if ((int)uVar3 < 0x19) goto LAB_005a4e2b;
  goto LAB_005a49d1;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}